

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O3

int __thiscall
luna::Function::AddUpvalue(Function *this,String *name,bool parent_local,int register_index)

{
  iterator __position;
  pointer pUVar1;
  UpvalueInfo local_20;
  
  local_20.parent_local_ = parent_local;
  __position._M_current =
       (this->upvalues_).
       super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->upvalues_).
      super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_20.name_ = name;
    local_20.register_index_ = register_index;
    std::vector<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>::
    _M_realloc_insert<luna::Function::UpvalueInfo>(&this->upvalues_,__position,&local_20);
    pUVar1 = (this->upvalues_).
             super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (__position._M_current)->name_ = name;
    (__position._M_current)->parent_local_ = parent_local;
    *(undefined3 *)&(__position._M_current)->field_0x9 = local_20._9_3_;
    (__position._M_current)->register_index_ = register_index;
    pUVar1 = (this->upvalues_).
             super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->upvalues_).
    super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = pUVar1;
  }
  return (int)((ulong)((long)pUVar1 -
                      (long)(this->upvalues_).
                            super__Vector_base<luna::Function::UpvalueInfo,_std::allocator<luna::Function::UpvalueInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
}

Assistant:

int Function::AddUpvalue(String *name, bool parent_local, int register_index)
    {
        upvalues_.push_back(UpvalueInfo(name, parent_local, register_index));
        return upvalues_.size() - 1;
    }